

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O0

void __thiscall xercesc_4_0::ICUTransService::upperCase(ICUTransService *this,XMLCh *toUpperCase)

{
  XMLCh *toUpperCase_local;
  ICUTransService *this_local;
  
  doCaseConvert<int(*)(int)>(toUpperCase,u_toupper_70);
  return;
}

Assistant:

void ICUTransService::upperCase(XMLCh* const toUpperCase)
{
    doCaseConvert(toUpperCase, u_toupper);
}